

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<kj::Array<char>_>::~Array(Array<kj::Array<char>_> *this)

{
  Array<char> *pAVar1;
  size_t sVar2;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Array<char> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Array<char> *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Array<char>,_false>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }